

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O0

Dec_Edge_t Dec_FactorLF_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover,Mvc_Cover_t *pSimple)

{
  Mvc_Cover_t *pCover_00;
  Mvc_Cover_t *pFForm_00;
  Dec_Edge_t DVar1;
  Dec_Edge_t DVar2;
  int iVar3;
  Mvc_Cube_t *pCube;
  Dec_Edge_t eNodeAnd;
  Dec_Edge_t eNodeRem;
  Dec_Edge_t eNodeQuo;
  Dec_Edge_t eNodeDiv;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *pDiv;
  Vec_Int_t *vEdgeLits;
  Dec_Man_t *pManDec;
  Mvc_Cover_t *pSimple_local;
  Mvc_Cover_t *pCover_local;
  Dec_Graph_t *pFForm_local;
  
  pManDec = (Dec_Man_t *)pSimple;
  pSimple_local = pCover;
  pCover_local = (Mvc_Cover_t *)pFForm;
  vEdgeLits = (Vec_Int_t *)Abc_FrameReadManDec();
  pDiv = *(Mvc_Cover_t **)(vEdgeLits + 1);
  pQuo = Mvc_CoverBestLiteralCover(pSimple_local,(Mvc_Cover_t *)pManDec);
  Mvc_CoverDivideByLiteral(pSimple_local,pQuo,&pRem,(Mvc_Cover_t **)&eNodeQuo);
  pFForm_00 = pCover_local;
  pCover_00 = pQuo;
  pCube = Mvc_CoverReadCubeHead(pQuo);
  DVar1 = Dec_FactorTrivialCube((Dec_Graph_t *)pFForm_00,pCover_00,pCube,(Vec_Int_t *)pDiv);
  Mvc_CoverFree(pQuo);
  DVar2 = Dec_Factor_rec((Dec_Graph_t *)pCover_local,pRem);
  Mvc_CoverFree(pRem);
  DVar1 = Dec_GraphAddNodeAnd((Dec_Graph_t *)pCover_local,DVar1,DVar2);
  iVar3 = Mvc_CoverReadCubeNum(_eNodeQuo);
  if (iVar3 == 0) {
    Mvc_CoverFree(_eNodeQuo);
    pFForm_local._4_4_ = DVar1;
  }
  else {
    DVar2 = Dec_Factor_rec((Dec_Graph_t *)pCover_local,_eNodeQuo);
    Mvc_CoverFree(_eNodeQuo);
    pFForm_local._4_4_ = Dec_GraphAddNodeOr((Dec_Graph_t *)pCover_local,DVar1,DVar2);
  }
  return pFForm_local._4_4_;
}

Assistant:

Dec_Edge_t Dec_FactorLF_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover, Mvc_Cover_t * pSimple )
{
    Dec_Man_t * pManDec = (Dec_Man_t *)Abc_FrameReadManDec();
    Vec_Int_t * vEdgeLits  = pManDec->vLits;
    Mvc_Cover_t * pDiv, * pQuo, * pRem;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd;

    // get the most often occurring literal
    pDiv = Mvc_CoverBestLiteralCover( pCover, pSimple );
    // divide the cover by the literal
    Mvc_CoverDivideByLiteral( pCover, pDiv, &pQuo, &pRem );
    // get the node pointer for the literal
    eNodeDiv = Dec_FactorTrivialCube( pFForm, pDiv, Mvc_CoverReadCubeHead(pDiv), vEdgeLits );
    Mvc_CoverFree( pDiv );
    // factor the quotient and remainder
    eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
    Mvc_CoverFree( pQuo );
    eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
    if ( Mvc_CoverReadCubeNum(pRem) == 0 )
    {
        Mvc_CoverFree( pRem );
        return eNodeAnd;
    }
    else
    {
        eNodeRem = Dec_Factor_rec( pFForm, pRem );
        Mvc_CoverFree( pRem );
        return Dec_GraphAddNodeOr( pFForm,  eNodeAnd, eNodeRem );
    }
}